

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O3

dgEdge * __thiscall dgPolyhedra::AddFace(dgPolyhedra *this,HaI32 count,HaI32 *index,HaI64 *userdata)

{
  ulong uVar1;
  int iVar2;
  dgTreeNode *pdVar3;
  int iVar4;
  dgTreeNode *pdVar5;
  dgEdge *pdVar6;
  ulong uVar7;
  long lVar8;
  undefined4 in_register_00000034;
  ulong uVar9;
  uint uVar10;
  dgPairKey key;
  ulong uVar11;
  HaI32 HVar12;
  ulong uVar13;
  HaU64 HVar14;
  ulong uVar15;
  dgEdge *pdVar16;
  bool bVar17;
  bool state;
  dgEdge tmpEdge_1;
  dgEdge tmpEdge;
  bool local_40c9;
  dgEdge *local_40c8;
  ulong local_40c0;
  dgPolyhedra *local_40b8;
  HaI64 *local_40b0;
  HaI32 *local_40a8;
  dgTreeNode *local_40a0;
  dgEdge local_4098;
  dgEdge local_4068;
  ulong local_4030 [2048];
  
  local_40c0 = CONCAT44(in_register_00000034,count);
  iVar4 = count + -1;
  if (0 < count) {
    local_40c8 = (dgEdge *)0x0;
    uVar9 = 0;
    uVar10 = 0;
    pdVar5 = (this->super_dgTree<dgEdge,_long>).m_head;
    HVar12 = index[iVar4];
    do {
      iVar2 = index[uVar9];
      uVar11 = (long)HVar12 << 0x20 | (long)iVar2;
      if ((int)uVar10 < 1) {
        uVar15 = 0;
LAB_00859a69:
        local_4030[uVar15] = uVar11;
        uVar10 = uVar10 + 1;
      }
      else {
        if (local_4030[0] == uVar11) {
          return (dgEdge *)0x0;
        }
        uVar15 = (ulong)uVar10;
        uVar7 = 0;
        do {
          if (uVar15 - 1 == uVar7) goto LAB_00859a69;
          uVar13 = uVar7 + 1;
          lVar8 = uVar7 + 1;
          uVar7 = uVar13;
        } while (local_4030[lVar8] != uVar11);
        if (uVar13 < uVar15) {
          return (dgEdge *)0x0;
        }
      }
      uVar15 = (long)iVar2 << 0x20 | (long)HVar12;
      if ((int)uVar10 < 1) {
        uVar7 = 0;
LAB_00859ab9:
        local_4030[uVar7] = uVar15;
        uVar10 = uVar10 + 1;
        bVar17 = true;
      }
      else {
        if (local_4030[0] == uVar15) {
          return (dgEdge *)0x0;
        }
        uVar7 = (ulong)uVar10;
        uVar13 = 0;
        do {
          if (uVar7 - 1 == uVar13) goto LAB_00859ab9;
          uVar1 = uVar13 + 1;
          lVar8 = uVar13 + 1;
          uVar13 = uVar1;
        } while (local_4030[lVar8] != uVar15);
        bVar17 = uVar7 <= uVar1;
      }
      if (!bVar17) {
        return (dgEdge *)0x0;
      }
      pdVar3 = pdVar5;
      if (HVar12 == iVar2) {
        return (dgEdge *)0x0;
      }
      for (; pdVar3 != (dgTreeNode *)0x0;
          pdVar3 = *(dgTreeNode **)
                    ((long)&(pdVar3->super_dgRedBackNode)._vptr_dgRedBackNode + lVar8)) {
        lVar8 = 8;
        if ((pdVar3->m_key <= (long)uVar11) && (lVar8 = 0x10, (long)uVar11 <= pdVar3->m_key)) {
          return (dgEdge *)0x0;
        }
      }
      uVar9 = uVar9 + 1;
      HVar12 = iVar2;
    } while (uVar9 != (uint)count);
  }
  local_4068.m_incidentFace = this->m_faceSecuence + 1;
  this->m_faceSecuence = local_4068.m_incidentFace;
  local_4068.m_incidentVertex = index[iVar4];
  uVar10 = *index;
  if (userdata == (HaI64 *)0x0) {
    local_4068.m_userData = 0;
    HVar14 = 0;
  }
  else {
    local_4068.m_userData = userdata[iVar4];
    HVar14 = *userdata;
  }
  local_4068.m_next = (dgEdge *)0x0;
  local_4068.m_prev._0_4_ = 0;
  local_4068.m_prev._4_4_ = 0;
  local_4068.m_twin._0_4_ = 0;
  local_4068._36_8_ = 0;
  local_40b8 = this;
  local_40b0 = userdata;
  local_40a8 = index;
  local_40a0 = dgTree<dgEdge,_long>::Insert
                         (&this->super_dgTree<dgEdge,_long>,&local_4068,
                          (long)local_4068.m_incidentVertex << 0x20 | (long)(int)uVar10,&local_40c9)
  ;
  if (local_40c9 == true) {
    __assert_fail("!state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                  ,0x773,
                  "dgEdge *dgPolyhedra::AddFace(hacd::HaI32, const hacd::HaI32 *const, const hacd::HaI64 *const)"
                 );
  }
  pdVar6 = &local_40a0->m_info;
  local_40c8 = pdVar6;
  if (1 < (int)local_40c0) {
    uVar9 = 1;
    local_40c0 = local_40c0 & 0xffffffff;
    local_4098.m_userData = HVar14;
    pdVar16 = pdVar6;
    local_4098.m_incidentVertex = uVar10;
    do {
      if (local_40b0 == (HaI64 *)0x0) {
        HVar14 = 0;
      }
      else {
        HVar14 = local_40b0[uVar9];
      }
      uVar10 = local_40a8[uVar9];
      local_4098.m_incidentFace = local_40b8->m_faceSecuence;
      local_4098.m_twin._0_4_ = 0;
      local_4098._36_8_ = 0;
      local_4098.m_next = (dgEdge *)0x0;
      local_4098.m_prev._0_4_ = 0;
      local_4098.m_prev._4_4_ = 0;
      pdVar5 = dgTree<dgEdge,_long>::Insert
                         (&local_40b8->super_dgTree<dgEdge,_long>,&local_4098,
                          (ulong)(uint)local_4098.m_incidentVertex << 0x20 | (long)(int)uVar10,
                          &local_40c9);
      if (local_40c9 == true) {
        __assert_fail("!state",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                      ,0x780,
                      "dgEdge *dgPolyhedra::AddFace(hacd::HaI32, const hacd::HaI32 *const, const hacd::HaI64 *const)"
                     );
      }
      pdVar6 = &pdVar5->m_info;
      uVar9 = uVar9 + 1;
      pdVar16->m_next = pdVar6;
      (pdVar5->m_info).m_prev = pdVar16;
      local_4098.m_userData = HVar14;
      pdVar16 = pdVar6;
      local_4098.m_incidentVertex = uVar10;
    } while (local_40c0 != uVar9);
  }
  (local_40a0->m_info).m_prev = pdVar6;
  pdVar6->m_next = local_40c8;
  return (local_40a0->m_info).m_next;
}

Assistant:

dgEdge* dgPolyhedra::AddFace ( hacd::HaI32 count, const hacd::HaI32* const index, const hacd::HaI64* const userdata)
{
	class IntersectionFilter
	{
		public:
		IntersectionFilter ()
		{
			m_count = 0;
		}

		bool Insert (hacd::HaI32 dummy, hacd::HaI64 value)
		{
			hacd::HaI32 i;				
			for (i = 0 ; i < m_count; i ++) {
				if (m_array[i] == value) {
					return false;
				}
			}
			m_array[i] = value;
			m_count ++;
			return true;
		}

		hacd::HaI32 m_count;
		hacd::HaI64 m_array[2048];
	};

	IntersectionFilter selfIntersectingFaceFilter;

	hacd::HaI32 dummyValues = 0;
	hacd::HaI32 i0 = index[count-1];
	for (hacd::HaI32 i = 0; i < count; i ++) {
		hacd::HaI32 i1 = index[i];
		dgPairKey code0 (i0, i1);

		if (!selfIntersectingFaceFilter.Insert (dummyValues, code0.GetVal())) {
			return NULL;
		}

		dgPairKey code1 (i1, i0);
		if (!selfIntersectingFaceFilter.Insert (dummyValues, code1.GetVal())) {
			return NULL;
		}


		if (i0 == i1) {
			return NULL;
		}
		if (FindEdge (i0, i1)) {
			return NULL;
		}
		i0 = i1;
	}

	m_faceSecuence ++;

	i0 = index[count-1];
	hacd::HaI32 i1 = index[0];
	hacd::HaU64 udata0 = 0;
	hacd::HaU64 udata1 = 0;
	if (userdata) {
		udata0 = hacd::HaU64 (userdata[count-1]);
		udata1 = hacd::HaU64 (userdata[0]);
	} 

	bool state;
	dgPairKey code (i0, i1);
	dgEdge tmpEdge (i0, m_faceSecuence, udata0);
	dgTreeNode* node = Insert (tmpEdge, code.GetVal(), state); 
	HACD_ASSERT (!state);
	dgEdge* edge0 = &node->GetInfo();
	dgEdge* const first = edge0;

	for (hacd::HaI32 i = 1; i < count; i ++) {
		i0 = i1;
		i1 = index[i];
		udata0 = udata1;
		udata1 = hacd::HaU64 (userdata ? userdata[i] : 0);

		dgPairKey code (i0, i1);
		dgEdge tmpEdge (i0, m_faceSecuence, udata0);
		node = Insert (tmpEdge, code.GetVal(), state); 
		HACD_ASSERT (!state);

		dgEdge* const edge1 = &node->GetInfo();
		edge0->m_next = edge1;
		edge1->m_prev = edge0;
		edge0 = edge1;
	}

	first->m_prev = edge0;
	edge0->m_next = first;

	return first->m_next;
}